

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_29792f8::LowBDConvolveScaleTest::RunOne(LowBDConvolveScaleTest *this,bool ref)

{
  int iVar1;
  int iVar2;
  TestImage<unsigned_char> *pTVar3;
  pointer puVar4;
  pointer puVar5;
  long lVar6;
  undefined7 in_register_00000031;
  long lVar7;
  
  pTVar3 = (this->super_ConvolveScaleTestBase<unsigned_char>).image_;
  if ((int)CONCAT71(in_register_00000031,ref) == 0) {
    iVar1 = pTVar3->src_stride_;
    lVar6 = (long)pTVar3->h_ + 0x40;
    puVar4 = (pTVar3->src_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar2 = pTVar3->dst_stride_;
    lVar7 = (long)((int)lVar6 * iVar2);
    puVar5 = (pTVar3->dst_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (this->super_ConvolveScaleTestBase<unsigned_char>).convolve_params_.dst =
         (pTVar3->dst_16_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
         _M_impl.super__Vector_impl_data._M_start + lVar7 + (long)iVar2 * 0x20 + 0x20;
    (*this->tst_fun_)(puVar4 + (long)iVar1 * 0x20 + lVar6 * iVar1 + 0x20,iVar1,
                      puVar5 + (long)iVar2 * 0x20 + lVar7 + 0x20,iVar2,
                      (this->super_ConvolveScaleTestBase<unsigned_char>).width_,
                      (this->super_ConvolveScaleTestBase<unsigned_char>).height_,
                      (this->super_ConvolveScaleTestBase<unsigned_char>).filter_x_,
                      (this->super_ConvolveScaleTestBase<unsigned_char>).filter_y_,
                      (this->super_ConvolveScaleTestBase<unsigned_char>).subpel_x_,0x10,
                      (this->super_ConvolveScaleTestBase<unsigned_char>).subpel_y_,0x14,
                      &(this->super_ConvolveScaleTestBase<unsigned_char>).convolve_params_);
  }
  else {
    iVar1 = pTVar3->src_stride_;
    puVar4 = (pTVar3->src_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar5 = (pTVar3->dst_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar2 = pTVar3->dst_stride_;
    (this->super_ConvolveScaleTestBase<unsigned_char>).convolve_params_.dst =
         (pTVar3->dst_16_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
         _M_impl.super__Vector_impl_data._M_start + (long)iVar2 * 0x20 + 0x20;
    av1_convolve_2d_scale_c
              (puVar4 + (long)iVar1 * 0x20 + 0x20,iVar1,puVar5 + (long)iVar2 * 0x20 + 0x20,iVar2,
               (this->super_ConvolveScaleTestBase<unsigned_char>).width_,
               (this->super_ConvolveScaleTestBase<unsigned_char>).height_,
               (this->super_ConvolveScaleTestBase<unsigned_char>).filter_x_,
               (this->super_ConvolveScaleTestBase<unsigned_char>).filter_y_,
               (this->super_ConvolveScaleTestBase<unsigned_char>).subpel_x_,0x10,
               (this->super_ConvolveScaleTestBase<unsigned_char>).subpel_y_,0x14,
               &(this->super_ConvolveScaleTestBase<unsigned_char>).convolve_params_);
  }
  return;
}

Assistant:

void RunOne(bool ref) override {
    const uint8_t *src = image_->GetSrcData(ref, false);
    uint8_t *dst = image_->GetDstData(ref, false);
    convolve_params_.dst = image_->GetDst16Data(ref, false);
    const int src_stride = image_->src_stride();
    const int dst_stride = image_->dst_stride();
    if (ref) {
      av1_convolve_2d_scale_c(src, src_stride, dst, dst_stride, width_, height_,
                              filter_x_, filter_y_, subpel_x_, kXStepQn,
                              subpel_y_, kYStepQn, &convolve_params_);
    } else {
      tst_fun_(src, src_stride, dst, dst_stride, width_, height_, filter_x_,
               filter_y_, subpel_x_, kXStepQn, subpel_y_, kYStepQn,
               &convolve_params_);
    }
  }